

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void inactive_browse_cb(Fl_Button *b,void *v)

{
  bool bVar1;
  int iVar2;
  Fluid_Image *pFVar3;
  Fl_Widget_Type *this;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar2 != 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar2 == 0) {
        Fl_Widget::activate(&b->super_Fl_Widget);
        return;
      }
    }
    Fl_Widget::deactivate(&b->super_Fl_Widget);
    return;
  }
  pFVar3 = ui_find_image((inactive_input->super_Fl_Input_).value_);
  if (pFVar3 != (Fluid_Image *)0x0) {
    Fl_Input_::value(&inactive_input->super_Fl_Input_,ui_find_image_name);
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar1 = false;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
          if (iVar2 != 0) {
            Fl_Widget_Type::inactive_name(this,ui_find_image_name);
            bVar1 = true;
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (bVar1) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void inactive_browse_cb(Fl_Button* b, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget() && !current_widget->is_window()) 
      b->activate();
    else 
      b->deactivate();
  } else {
    int mod = 0;
    if (ui_find_image(inactive_input->value())) {
      inactive_input->value(ui_find_image_name);
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	if (o->selected && o->is_widget()) {
	  ((Fl_Widget_Type*)o)->inactive_name(ui_find_image_name);
	  mod = 1;
	}
      }
      if (mod) set_modflag(1);
    }
  }
}